

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddressFilter.cpp
# Opt level: O2

uint32_t __thiscall AddressUseTracker::Check(AddressUseTracker *this,uint8_t *addr,size_t len)

{
  uint32_t uVar1;
  IPAsKeyLRU *key;
  IPAsKeyLRU *pIVar2;
  size_t __n;
  bool stored;
  
  key = (IPAsKeyLRU *)operator_new(0x48);
  (key->super_IPAsKey).HashNext = (IPAsKey *)0x0;
  (key->super_IPAsKey).count = 1;
  (key->super_IPAsKey).hash = 0;
  __n = 0x10;
  if (len < 0x10) {
    __n = len;
  }
  memcpy((key->super_IPAsKey).addr,addr,__n);
  (key->super_IPAsKey).addr_len = __n;
  (key->super_IPAsKey)._vptr_IPAsKey = (_func_int **)&PTR__IPAsKeyLRU_001e8590;
  key->MoreRecentKey = (IPAsKeyLRU *)0x0;
  key->LessRecentKey = (IPAsKeyLRU *)0x0;
  while (this->table_lru_max <= (this->table).binHash.tableCount) {
    pIVar2 = LruHash<IPAsKeyLRU>::RemoveLRU(&this->table);
    if (pIVar2 != (IPAsKeyLRU *)0x0) {
      (*(pIVar2->super_IPAsKey)._vptr_IPAsKey[1])(pIVar2);
    }
  }
  stored = false;
  pIVar2 = LruHash<IPAsKeyLRU>::InsertOrAdd(&this->table,key,false,&stored);
  if (stored == false) {
    (*(key->super_IPAsKey)._vptr_IPAsKey[1])(key);
  }
  if (pIVar2 == (IPAsKeyLRU *)0x0) {
    uVar1 = 1;
  }
  else {
    uVar1 = (pIVar2->super_IPAsKey).count;
  }
  return uVar1;
}

Assistant:

uint32_t AddressUseTracker::Check(uint8_t * addr, size_t len)
{
    IPAsKeyLRU * x = new IPAsKeyLRU(addr, len);
    uint32_t count = 1;

    while (table.GetCount() >= table_lru_max)
    {
        IPAsKeyLRU * removed = table.RemoveLRU();

        if (removed != NULL)
        {
            delete removed;
        }
    }

    if (x != NULL)
    {
        bool stored = false;

        IPAsKeyLRU * y = table.InsertOrAdd(x, false, &stored);

        if (!stored)
        {
            delete x;
        }

        if (y != NULL)
        {
            count = y->count;
        }
    }

    return count;
}